

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_generator.cc
# Opt level: O1

void __thiscall google::protobuf::compiler::cpp::CppGenerator::~CppGenerator(CppGenerator *this)

{
  pointer pcVar1;
  
  (this->super_CodeGenerator)._vptr_CodeGenerator = (_func_int **)&PTR__CppGenerator_004dc3d8;
  pcVar1 = (this->runtime_include_base_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->runtime_include_base_).field_2) {
    operator_delete(pcVar1);
  }
  CodeGenerator::~CodeGenerator(&this->super_CodeGenerator);
  return;
}

Assistant:

CppGenerator::~CppGenerator() {}